

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

Point3f __thiscall
pbrt::RealisticCamera::SampleExitPupil
          (RealisticCamera *this,Point2f pFilm,Point2f lensSample,Float *sampleBoundsArea)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Bounds2<float> *pBVar5;
  size_t sVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 in_register_00001208 [56];
  undefined1 auVar15 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 in_ZMM4 [64];
  float fVar18;
  Point3f PVar19;
  
  auVar17 = in_ZMM4._0_16_;
  auVar16._8_56_ = in_register_00001248;
  auVar16._0_8_ = lensSample.super_Tuple2<pbrt::Point2,_float>;
  auVar15._8_56_ = in_register_00001208;
  auVar15._0_8_ = pFilm.super_Tuple2<pbrt::Point2,_float>;
  auVar13 = vmovshdup_avx(auVar15._0_16_);
  fVar14 = pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  fVar18 = auVar13._0_4_;
  fVar12 = fVar14 * fVar14 + fVar18 * fVar18;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    auVar8 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
    fVar12 = auVar8._0_4_;
  }
  pBVar5 = (this->exitPupilBounds).ptr;
  sVar6 = (this->exitPupilBounds).nStored;
  auVar17 = vcvtusi2ss_avx512f(auVar17,sVar6);
  iVar11 = (int)((fVar12 / (*(float *)(((this->super_CameraBase).film.
                                        super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                       0xffffffffffff) + 0x20) * 0.5)) * auVar17._0_4_);
  iVar10 = (int)sVar6 + -1;
  if (iVar11 <= iVar10) {
    iVar10 = iVar11;
  }
  fVar1 = pBVar5[iVar10].pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fVar2 = pBVar5[iVar10].pMin.super_Tuple2<pbrt::Point2,_float>.y;
  fVar3 = pBVar5[iVar10].pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fVar4 = pBVar5[iVar10].pMax.super_Tuple2<pbrt::Point2,_float>.y;
  if (sampleBoundsArea != (Float *)0x0) {
    *sampleBoundsArea = (fVar3 - fVar1) * (fVar4 - fVar2);
  }
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                           ZEXT416((uint)(1.0 - lensSample.super_Tuple2<pbrt::Point2,_float>.x)),
                           ZEXT416((uint)(lensSample.super_Tuple2<pbrt::Point2,_float>.x * fVar3)));
  auVar17 = vmovshdup_avx(auVar16._0_16_);
  auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(1.0 - auVar17._0_4_)),
                            ZEXT416((uint)(auVar17._0_4_ * fVar4)));
  bVar7 = fVar12 != 0.0;
  fVar18 = (float)((uint)bVar7 * (int)(fVar18 / fVar12));
  auVar13._4_12_ = auVar13._4_12_;
  auVar13._0_4_ = fVar18;
  fVar12 = (float)((uint)bVar7 * (int)(fVar14 / fVar12) + (uint)!bVar7 * 0x3f800000);
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar17._0_4_ * fVar18)),ZEXT416((uint)fVar12),auVar8);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * auVar17._0_4_)),auVar13,auVar8);
  auVar13 = vinsertps_avx(auVar9,auVar13,0x10);
  PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar13._0_8_;
  PVar19.super_Tuple3<pbrt::Point3,_float>.z =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
  return (Point3f)PVar19.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f RealisticCamera::SampleExitPupil(Point2f pFilm, Point2f lensSample,
                                         Float *sampleBoundsArea) const {
    // Find exit pupil bound for sample distance from film center
    Float rFilm = std::sqrt(Sqr(pFilm.x) + Sqr(pFilm.y));
    int rIndex = rFilm / (film.Diagonal() / 2) * exitPupilBounds.size();
    rIndex = std::min<int>(exitPupilBounds.size() - 1, rIndex);
    Bounds2f pupilBounds = exitPupilBounds[rIndex];
    if (sampleBoundsArea != nullptr)
        *sampleBoundsArea = pupilBounds.Area();

    // Generate sample point inside exit pupil bound
    Point2f pLens = pupilBounds.Lerp(lensSample);

    // Return sample point rotated by angle of _pFilm_ with $+x$ axis
    Float sinTheta = (rFilm != 0) ? pFilm.y / rFilm : 0;
    Float cosTheta = (rFilm != 0) ? pFilm.x / rFilm : 1;
    return {cosTheta * pLens.x - sinTheta * pLens.y,
            sinTheta * pLens.x + cosTheta * pLens.y, LensRearZ()};
}